

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImStrdup(char *str)

{
  size_t sVar1;
  char *__dest;
  char *in_RDI;
  void *buf;
  size_t len;
  size_t in_stack_ffffffffffffffe0;
  
  sVar1 = strlen(in_RDI);
  __dest = (char *)ImGui::MemAlloc(in_stack_ffffffffffffffe0);
  memcpy(__dest,in_RDI,sVar1 + 1);
  return __dest;
}

Assistant:

char* ImStrdup(const char* str)
{
    size_t len = strlen(str);
    void* buf = ImGui::MemAlloc(len + 1);
    return (char*)memcpy(buf, (const void*)str, len + 1);
}